

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O1

unique_ptr<BupOutputter,_std::default_delete<BupOutputter>_> BupOutputter::makeComposited(void)

{
  undefined8 *__s;
  __uniq_ptr_data<BupOutputter,_std::default_delete<BupOutputter>,_true,_true> in_RDI;
  
  __s = (undefined8 *)operator_new(0x180);
  memset(__s,0,0x180);
  *__s = &PTR__CompositedBupOutputter_0011dc50;
  std::filesystem::__cxx11::path::path((path *)(__s + 1));
  __s[8] = 0;
  __s[9] = 0;
  __s[6] = 0;
  __s[7] = 0;
  __s[10] = __s + 0xc;
  __s[0xb] = 0;
  *(undefined1 *)(__s + 0xc) = 0;
  __s[0xe] = 0;
  __s[0xf] = 0;
  __s[0x10] = 0;
  __s[0x11] = 0;
  __s[0x12] = __s + 0x14;
  __s[0x13] = 0;
  *(undefined1 *)(__s + 0x14) = 0;
  __s[0x16] = 0;
  __s[0x17] = 0;
  __s[0x18] = 0;
  __s[0x19] = 0;
  __s[0x1a] = __s + 0x1c;
  __s[0x1b] = 0;
  *(undefined1 *)(__s + 0x1c) = 0;
  *__s = &PTR__MTCompositedBupOutputter_0011dbc8;
  ThreadedImageSaver::ThreadedImageSaver((ThreadedImageSaver *)(__s + 0x1e));
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<BupOutputter,_std::default_delete<BupOutputter>_>._M_t.
   super__Tuple_impl<0UL,_BupOutputter_*,_std::default_delete<BupOutputter>_>.
   super__Head_base<0UL,_BupOutputter_*,_false>._M_head_impl = __s;
  return (__uniq_ptr_data<BupOutputter,_std::default_delete<BupOutputter>,_true,_true>)
         (tuple<BupOutputter_*,_std::default_delete<BupOutputter>_>)
         in_RDI.super___uniq_ptr_impl<BupOutputter,_std::default_delete<BupOutputter>_>._M_t.
         super__Tuple_impl<0UL,_BupOutputter_*,_std::default_delete<BupOutputter>_>.
         super__Head_base<0UL,_BupOutputter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<BupOutputter> BupOutputter::makeComposited() {
#if ENABLE_MULTITHREADED
	return std::make_unique<MTCompositedBupOutputter>();
#else
	return std::make_unique<CompositedBupOutputter>();
#endif
}